

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::SequenceMethod::SequenceMethod
          (SequenceMethod *this,KnownSystemName knownNameId,bool isMatched)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b5fd8;
  sVar1 = parsing::toString(knownNameId);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = Function;
  (this->super_SystemSubroutine).knownNameId = knownNameId;
  (this->super_SystemSubroutine).hasOutputArgs = false;
  (this->super_SystemSubroutine).neverReturns = false;
  (this->super_SystemSubroutine).withClauseMode = None;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b3148;
  this->isMatched = isMatched;
  return;
}

Assistant:

SequenceMethod(KnownSystemName knownNameId, bool isMatched) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isMatched(isMatched) {}